

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptCaseLabel(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  TIntermBranch *pTVar2;
  char *syntax;
  TIntermTyped *expression;
  TSourceLoc loc;
  TIntermTyped *local_30;
  TSourceLoc local_28;
  
  local_28.column = (this->super_HlslTokenStream).token.loc.column;
  local_28._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  local_28.name = (this->super_HlslTokenStream).token.loc.name;
  local_28.string = (this->super_HlslTokenStream).token.loc.string;
  local_28.line = (this->super_HlslTokenStream).token.loc.line;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokCase);
  if (bVar1) {
    bVar1 = acceptExpression(this,&local_30);
    if (bVar1) {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
      if (bVar1) {
        pTVar2 = TIntermediate::addBranch
                           ((this->parseContext->super_TParseContextBase).super_TParseVersions.
                            intermediate,EOpCase,local_30,&local_28);
        *statement = &pTVar2->super_TIntermNode;
        return true;
      }
      syntax = ":";
    }
    else {
      syntax = "case expression";
    }
    expected(this,syntax);
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptCaseLabel(TIntermNode*& statement)
{
    TSourceLoc loc = token.loc;
    if (! acceptTokenClass(EHTokCase))
        return false;

    TIntermTyped* expression;
    if (! acceptExpression(expression)) {
        expected("case expression");
        return false;
    }

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    statement = parseContext.intermediate.addBranch(EOpCase, expression, loc);

    return true;
}